

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

void skiwi::print_last_global_variable_used
               (ostream *out,shared_ptr<skiwi::environment<skiwi::environment_entry>_> *env,
               repl_data *rd,context *p_ctxt)

{
  _Rb_tree_header *__last;
  element_type *peVar1;
  bool bVar2;
  uint uVar3;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>
  _Var4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  uint64_t pos;
  string varname;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>
  res;
  uint64_t ind;
  stringstream ss;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b0;
  ostream local_1a8 [376];
  
  if ((p_ctxt != (context *)0x0) &&
     ((env->
      super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr != (element_type *)0x0)) {
    std::operator<<(out,"\ncall stack:\n");
    for (uVar3 = 4; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
      pos = p_ctxt->last_global_variable_used[uVar3];
      res.first._M_dataplus._M_p = (pointer)&res.first.field_2;
      res.first._M_string_length = 0;
      res.first.field_2._M_local_buf[0] = '\0';
      peVar1 = (env->
               super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      __last = &(peVar1->env)._M_t._M_impl.super__Rb_tree_header;
      _Var4 = std::
              find_if<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>,skiwi::print_last_global_variable_used(std::ostream&,std::shared_ptr<skiwi::environment<skiwi::environment_entry>>,skiwi::repl_data_const&,skiwi::context_const*)::__0>
                        (*(_Base_ptr *)
                          ((long)&(peVar1->env)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10)
                         ,(_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>
                           )__last,(anon_class_8_1_ba1d6db4_for__M_pred)&pos);
      if ((_Rb_tree_header *)_Var4._M_node == __last) {
        std::__shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr((__shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                        *)&ss,&(peVar1->p_outer).
                               super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                      );
        while (_ss != (pointer)0x0) {
          _Var4 = std::
                  find_if<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>,skiwi::print_last_global_variable_used(std::ostream&,std::shared_ptr<skiwi::environment<skiwi::environment_entry>>,skiwi::repl_data_const&,skiwi::context_const*)::__0>
                            (*(_Base_ptr *)(_ss + 0x18),(_Base_ptr)(_ss + 8),
                             (anon_class_8_1_ba1d6db4_for__M_pred)&pos);
          if (_Var4._M_node != (_Base_ptr)(_ss + 8)) {
            std::pair<std::__cxx11::string,skiwi::environment_entry>::operator=
                      ((pair<std::__cxx11::string,skiwi::environment_entry> *)&res,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>
                        *)(_Var4._M_node + 1));
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0);
            goto LAB_0024e8fe;
          }
          std::
          __shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>::
          operator=((__shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                     *)&ss,(__shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                            *)(_ss + 0x30));
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0);
      }
      else {
        std::pair<std::__cxx11::string,skiwi::environment_entry>::operator=
                  ((pair<std::__cxx11::string,skiwi::environment_entry> *)&res,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>
                    *)(_Var4._M_node + 1));
LAB_0024e8fe:
        *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 4;
        poVar5 = (ostream *)std::ostream::operator<<(out,uVar3);
        std::operator<<(poVar5,": ");
        get_variable_name_before_alpha(&varname,&res.first);
        std::__cxx11::string::substr((ulong)&ss,(ulong)&varname);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&ss,"#%q");
        std::__cxx11::string::~string((string *)&ss);
        if (bVar2) {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          std::__cxx11::string::substr((ulong)&ind,(ulong)&varname);
          std::operator<<(local_1a8,(string *)&ind);
          std::__cxx11::string::~string((string *)&ind);
          std::istream::_M_extract<unsigned_long>((ulong *)&ss);
          for (p_Var6 = (rd->quote_to_index)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var6 != &(rd->quote_to_index)._M_t._M_impl.super__Rb_tree_header;
              p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
            if (*(uint64_t *)(p_Var6 + 2) == ind) {
              poVar5 = std::operator<<(out,"(quote ");
              poVar5 = std::operator<<(poVar5,(string *)(p_Var6 + 1));
              std::operator<<(poVar5,")\n");
            }
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        }
        else {
          poVar5 = std::operator<<(out,(string *)&varname);
          std::operator<<(poVar5,"\n");
        }
        std::__cxx11::string::~string((string *)&varname);
      }
      std::__cxx11::string::~string((string *)&res);
    }
  }
  return;
}

Assistant:

void print_last_global_variable_used(std::ostream& out, std::shared_ptr<SKIWI::environment<SKIWI::environment_entry>> env, const repl_data& rd, const context* p_ctxt)
  {
  if (!p_ctxt)
    return;
  if (!env.get())
    return;

  out << "\ncall stack:\n";
  for (int stack_item = SKIWI_VARIABLE_DEBUG_STACK_SIZE - 1; stack_item >= 0; --stack_item)
    {
    uint64_t pos = p_ctxt->last_global_variable_used[stack_item];
    std::pair<std::string, SKIWI::environment_entry> res;
    if (env->find_if(res, [&](const std::pair<std::string, SKIWI::environment_entry>& v) { return v.second.pos == pos; }))
      {
      out << std::setw(4) << stack_item << ": ";
      std::string varname = get_variable_name_before_alpha(res.first);
      if (varname.substr(0, 3) == "#%q")
        {
        std::stringstream ss;
        ss << varname.substr(3);
        uint64_t ind;
        ss >> ind;
        for (const auto& q : rd.quote_to_index)
          {
          if (q.second == ind)
            {
            out << "(quote " << q.first << ")\n";
            }
          }
        }
      else
        out << varname << "\n";
      }
    }
  }